

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multihash_test.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_b0ec::Decode_FromStringUsingOutParam_Test::~Decode_FromStringUsingOutParam_Test
          (Decode_FromStringUsingOutParam_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Decode, FromStringUsingOutParam) {
	std::string hash = "11148a173fd3e32c0fa78b90fe42d305f202244e2739";
	auto expectedDigest = multihash::Bytes{
	    0x8a, 0x17, 0x3f, 0xd3, 0xe3, 0x2c, 0x0f, 0xa7, 0x8b, 0x90,
	    0xfe, 0x42, 0xd3, 0x05, 0xf2, 0x02, 0x24, 0x4e, 0x27, 0x39,
	};

	multihash::Multihash m;
	auto optErr = multihash::decode(hash, m);
	ASSERT_FALSE(optErr) << "Expected no error. error: '" << optErr.value() << "'";

	EXPECT_EQ(0x11, m.getCode());
	EXPECT_EQ(multihash::hash::SHA1, m.getHash());
	EXPECT_EQ(20, m.size());
	EXPECT_EQ(expectedDigest, m.getDigest());
}